

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void __thiscall soplex::SPxLPBase<double>::unscaleLP(SPxLPBase<double> *this)

{
  Verbosity VVar1;
  SPxOut *in_RDI;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  _func_ostream_ptr_ostream_ptr *in_stack_ffffffffffffffd8;
  undefined4 local_18;
  Verbosity local_14 [5];
  
  if ((in_RDI[0x12]._vptr_SPxOut != (_func_int **)0x0) &&
     (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[0x12]._vptr_SPxOut), 4 < (int)VVar1)) {
    local_14[2] = SPxOut::getVerbosity((SPxOut *)in_RDI[0x12]._vptr_SPxOut);
    local_14[1] = 5;
    (**(code **)(*in_RDI[0x12]._vptr_SPxOut + 0x10))(in_RDI[0x12]._vptr_SPxOut,local_14 + 1);
    soplex::operator<<(in_RDI,(char *)in_stack_ffffffffffffffd8);
    soplex::operator<<(in_RDI,in_stack_ffffffffffffffd8);
    (**(code **)(*in_RDI[0x12]._vptr_SPxOut + 0x10))(in_RDI[0x12]._vptr_SPxOut,local_14 + 2);
  }
  if (in_RDI[0x11].m_streams == (ostream **)0x0) {
    if ((in_RDI[0x12]._vptr_SPxOut != (_func_int **)0x0) &&
       (VVar1 = SPxOut::getVerbosity((SPxOut *)in_RDI[0x12]._vptr_SPxOut), 4 < (int)VVar1)) {
      local_14[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[0x12]._vptr_SPxOut);
      local_18 = 5;
      (**(code **)(*in_RDI[0x12]._vptr_SPxOut + 0x10))(in_RDI[0x12]._vptr_SPxOut,&local_18);
      soplex::operator<<(in_RDI,(char *)in_stack_ffffffffffffffd8);
      soplex::operator<<(in_RDI,in_stack_ffffffffffffffd8);
      (**(code **)(*in_RDI[0x12]._vptr_SPxOut + 0x10))(in_RDI[0x12]._vptr_SPxOut,local_14);
    }
  }
  else {
    (**(code **)(*in_RDI[0x11].m_streams + 0x70))();
  }
  return;
}

Assistant:

void SPxLPBase<R>::unscaleLP()
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "remove persistent scaling of LP" << std::endl;)

   if(lp_scaler)
   {
      lp_scaler->unscale(*this);
   }
   else
   {
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "no LP scaler available" << std::endl;)
   }
}